

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attr.c
# Opt level: O3

void internal_dump_attr_list(FILE *out,attr_list list,int indent)

{
  size_t __size;
  char *__ptr;
  int iVar1;
  long lVar2;
  
  iVar1 = indent;
  if (0 < indent) {
    do {
      fwrite("    ",4,1,(FILE *)out);
      iVar1 = iVar1 + -1;
    } while (iVar1 != 0);
  }
  if (list == (attr_list)0x0) {
    __ptr = "[NULL]\n";
    __size = 7;
  }
  else {
    fwrite("[\n",2,1,(FILE *)out);
    if (list->list_of_lists == 0) {
      dump_attr_sublist(out,list,indent);
    }
    else if (0 < (list->l).lists.sublist_count) {
      lVar2 = 0;
      do {
        dump_attr_sublist(out,(list->l).lists.lists[lVar2],indent);
        lVar2 = lVar2 + 1;
      } while (lVar2 < (list->l).lists.sublist_count);
    }
    if (0 < indent) {
      do {
        fwrite("    ",4,1,(FILE *)out);
        indent = indent + -1;
      } while (indent != 0);
    }
    __ptr = "]\n";
    __size = 2;
  }
  fwrite(__ptr,__size,1,(FILE *)out);
  return;
}

Assistant:

static void
internal_dump_attr_list (FILE *out, attr_list list, int indent)
{
    int i = 0;
    for (i = 0; i< indent; i++) {
        fprintf(out, "    ");
    }
    if (list == NULL) {
        fprintf(out, "[NULL]\n");
        return;
    }
    fprintf(out, "[\n");
    if (!list->list_of_lists) {
        dump_attr_sublist(out, list, indent);
    } else {
        int i;
        for (i=0; i<list->l.lists.sublist_count; i++) {
            dump_attr_sublist(out, list->l.lists.lists[i], indent);
        }
    }
    for (i=0; i< indent; i++) {
        fprintf(out, "    ");
    }
    fprintf(out, "]\n");
}